

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalFederateId.hpp
# Opt level: O3

void __thiscall
helics::CoreBroker::routeMessage(CoreBroker *this,ActionMessage *cmd,GlobalFederateId dest)

{
  route_id rVar1;
  ulong uVar2;
  
  if (dest.gid == -2010000000) {
    return;
  }
  (cmd->dest_id).gid = dest.gid;
  uVar2 = 0;
  if ((dest.gid != 0) && ((this->super_BrokerBase).higher_broker_id.gid != dest.gid)) {
    rVar1 = getRoute(this,dest);
    uVar2 = (ulong)(uint)rVar1.rid;
  }
  (*(this->super_Broker)._vptr_Broker[0x22])(this,uVar2,cmd);
  return;
}

Assistant:

constexpr bool operator==(GlobalFederateId id) const noexcept { return (gid == id.gid); }